

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakebuiltins.cpp
# Opt level: O3

void addJsonArray(QJsonArray *array,QString *keyPrefix,ProValueMap *map)

{
  uint uVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  QStringBuilder<const_QString_&,_const_QString_&> local_b0;
  QString local_a0;
  QString local_88;
  QArrayDataPointer<QString> local_68;
  QStringBuilder<const_QString_&,_QLatin1String> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.d = (Data *)0x0;
  local_68.ptr = (QString *)0x0;
  local_68.size = 0;
  uVar1 = QJsonArray::size();
  QList<QString>::reserve((QList<QString> *)&local_68,(long)(int)uVar1);
  if (0 < (int)uVar1) {
    uVar2 = 0;
    do {
      local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QString::number((int)&local_88,(int)uVar2);
      QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                ((QMovableArrayOps<QString> *)&local_68,local_68.size,&local_88);
      QList<QString>::end((QList<QString> *)&local_68);
      QJsonArray::at((longlong)&local_50);
      local_b0.a = keyPrefix;
      local_b0.b = &local_88;
      QStringBuilder<const_QString_&,_const_QString_&>::convertTo<QString>(&local_a0,&local_b0);
      addJsonValue((QJsonValue *)&local_50,&local_a0,map);
      if (&(local_a0.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_a0.d.d)->super_QArrayData,2,0x10);
        }
      }
      QJsonValue::~QJsonValue((QJsonValue *)&local_50);
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
      uVar2 = uVar2 + 1;
    } while ((uVar1 & 0x7fffffff) != uVar2);
  }
  local_50.b.m_size = 6;
  local_50.b.m_data = "_KEYS_";
  local_50.a = keyPrefix;
  QStringBuilder<const_QString_&,_QLatin1String>::convertTo<QString>(&local_88,&local_50);
  insertJsonKeyValue(&local_88,(QStringList *)&local_68,map);
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void addJsonArray(const QJsonArray &array, const QString &keyPrefix, ProValueMap *map)
{
    QStringList keys;
    const int size = array.count();
    keys.reserve(size);
    for (int i = 0; i < size; ++i) {
        const QString number = QString::number(i);
        keys.append(number);
        addJsonValue(array.at(i), keyPrefix + number, map);
    }
    insertJsonKeyValue(keyPrefix + QLatin1String("_KEYS_"), keys, map);
}